

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::Reshape::backward_impl
          (Reshape *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor reshaped;
  Dim *in_stack_ffffffffffffff38;
  Tensor *in_stack_ffffffffffffff40;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff50;
  Tensor *in_stack_ffffffffffffff58;
  float local_78 [30];
  
  Tensor::Tensor(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,local_78);
  Tensor::operator*(in_stack_ffffffffffffff58);
  Tensor::operator*(in_stack_ffffffffffffff58);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Tensor::~Tensor((Tensor *)0x60a04a);
  return;
}

Assistant:

void Reshape::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Reshape not yet implemented for CUDA");
#else
  const Tensor reshaped(dEdxi.d, dEdf.v);
  *dEdxi += *reshaped;
#endif
}